

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

bool __thiscall DMessageBoxMenu::Responder(DMessageBoxMenu *this,event_t *ev)

{
  int iVar1;
  int ch;
  event_t *ev_local;
  DMessageBoxMenu *this_local;
  
  if ((ev->type == '\x04') && (ev->subtype == '\x01')) {
    if (this->mMessageMode == 0) {
      iVar1 = tolower((int)ev->data1);
      if ((iVar1 == 0x6e) || (iVar1 == 0x20)) {
        (*(this->super_DMenu).super_DObject._vptr_DObject[0xf])(this,0);
        this_local._7_1_ = true;
      }
      else if (iVar1 == 0x79) {
        (*(this->super_DMenu).super_DObject._vptr_DObject[0xf])(this,1);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
      this_local._7_1_ = true;
    }
  }
  else if (ev->type == '\x01') {
    (*(this->super_DMenu).super_DObject._vptr_DObject[0xd])();
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = DMenu::Responder(&this->super_DMenu,ev);
  }
  return this_local._7_1_;
}

Assistant:

bool DMessageBoxMenu::Responder(event_t *ev)
{
	if (ev->type == EV_GUI_Event && ev->subtype == EV_GUI_KeyDown)
	{
		if (mMessageMode == 0)
		{
			int ch = tolower(ev->data1);
			if (ch == 'n' || ch == ' ') 
			{
				HandleResult(false);		
				return true;
			}
			else if (ch == 'y') 
			{
				HandleResult(true);
				return true;
			}
		}
		else
		{
			Close();
			return true;
		}
		return false;
	}
	else if (ev->type == EV_KeyDown)
	{
		Close();
		return true;
	}
	return Super::Responder(ev);
}